

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Account::account_data_in_tabular_format(Account *this)

{
  key_type in_EAX;
  ostream *poVar1;
  iterator iVar2;
  int iVar3;
  bool bVar4;
  key_type local_28;
  int local_24;
  
  local_28 = in_EAX;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->account_number);
  poVar1 = std::operator<<(poVar1,"\t\t\t\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->client_id);
  poVar1 = std::operator<<(poVar1,"\t\t\t\t\t");
  _local_28 = CONCAT44((int)this->client_class,local_28);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&client_types_abi_cxx11_._M_t,&local_24);
  std::operator<<(poVar1,(string *)&iVar2._M_node[1]._M_parent);
  iVar3 = 0xf;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::operator<<((ostream *)&std::cout," ");
  }
  _local_28 = CONCAT44(local_24,(int)this->account_type);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&account_types_abi_cxx11_._M_t,&local_28);
  std::operator<<((ostream *)&std::cout,(string *)&iVar2._M_node[1]._M_parent);
  iVar3 = 10;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::operator<<((ostream *)&std::cout," ");
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->deposit);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Account::account_data_in_tabular_format(){
    /*!
     * It shows accoutn details in a tabular format :
     * account number, client id, account type, deposit amount
     */
    std::cout<<account_number<<"\t\t\t\t\t"<<client_id<<"\t\t\t\t\t"<<client_types.find(client_class)->second;
    int i;
    for(i=0;i<15;i++)
    {
        std::cout<<" ";
    }
    std::cout<<account_types.find(account_type)->second;
    for(i=0;i<10;i++)
    {
        std::cout<<" ";
    }
    std::cout<<deposit<<std::endl;
}